

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

led * __thiscall ev3dev::led::set_delay_off(led *__return_storage_ptr__,led *this,int v)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"delay_off",&local_41);
  device::set_attr_int(&this->super_device,&local_40,v);
  std::__cxx11::string::~string((string *)&local_40);
  led(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

led set_delay_off(int v) {
            set_attr_int("delay_off", v);
            return *this;
        }